

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  string *psVar2;
  bool local_b2;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88;
  cmValue local_68;
  cmValue ext;
  char local_49;
  string local_48;
  undefined1 local_25;
  BundleDirectoryLevel local_24;
  string *psStack_20;
  BundleDirectoryLevel level_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = level;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetFullName(&local_48,this,config,RuntimeBinaryArtifact);
  local_49 = '.';
  cmStrCat<std::__cxx11::string,char>(__return_storage_ptr__,&local_48,&local_49);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"BUNDLE_EXTENSION",&local_89);
  local_68 = GetProperty(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_b2 = cmValue::operator_cast_to_bool(&local_68);
  if (local_b2) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_68);
    std::__cxx11::string::string(local_b0,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"app",&local_b1);
  }
  local_b2 = !local_b2;
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_b0);
  std::__cxx11::string::~string(local_b0);
  if (local_b2) {
    std::allocator<char>::~allocator(&local_b1);
  }
  bVar1 = anon_unknown.dwarf_13b75ed::shouldAddContentLevel(local_24);
  if ((bVar1) && (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Contents");
    bVar1 = anon_unknown.dwarf_13b75ed::shouldAddFullLevel(local_24);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "app");
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}